

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.cpp
# Opt level: O0

bool __thiscall
llbuild::buildsystem::ShellCommand::processDiscoveredDependencies
          (ShellCommand *this,BuildSystem *system,TaskInterface ti,QueueJobContext *context)

{
  void *pvVar1;
  StringRef depsPath_00;
  StringRef depsPath_01;
  StringRef depsPath_02;
  bool bVar2;
  BuildSystemDelegate *pBVar3;
  size_t sVar4;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1U>
  *this_00;
  size_t sVar5;
  undefined8 uVar6;
  FileSystem *pFVar7;
  char *pcVar8;
  size_t sVar9;
  pointer pMVar10;
  error_code eVar11;
  int local_1224;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1200;
  undefined8 local_11e0;
  StringRef local_11d0;
  string local_11c0;
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> local_11a0;
  int local_1198;
  error_category *local_1190;
  Twine local_1188;
  Twine local_1170;
  Twine local_1158;
  Twine local_1140;
  StringRef local_1128;
  undefined1 local_1118 [8];
  SmallString<4096U> absPath;
  Twine local_100;
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> local_e8;
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> input;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *depsPath;
  iterator __end1;
  iterator __begin1;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1U>
  *__range1;
  QueueJobContext *context_local;
  BuildSystem *system_local;
  ShellCommand *this_local;
  TaskInterface ti_local;
  
  if (this->depsStyle == Unused) {
    pBVar3 = BuildSystem::getDelegate(system);
    sVar4 = strlen("missing required \'deps-style\' specifier");
    (*pBVar3->_vptr_BuildSystemDelegate[0xb])
              (pBVar3,this,"missing required \'deps-style\' specifier",sVar4);
    ti_local.ctx._7_1_ = 0;
  }
  else {
    this_00 = &this->depsPaths;
    __end1 = (iterator)
             (this_00->
             super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).
             super_SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             .
             super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             .super_SmallVectorBase.BeginX;
    pvVar1 = (this_00->
             super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).
             super_SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             .
             super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             .super_SmallVectorBase.BeginX;
    sVar5 = llvm::SmallVectorBase::size((SmallVectorBase *)this_00);
    for (; __end1 != (iterator)((long)pvVar1 + sVar5 * 0x20); __end1 = __end1 + 1) {
      input._M_t.super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>
      ._M_t.super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
      super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl =
           (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>
           )(__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>
             )__end1;
      std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>::
      unique_ptr<std::default_delete<llvm::MemoryBuffer>,void>
                ((unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>> *)&local_e8
                );
      llvm::Twine::Twine(&local_100,
                         (string *)
                         input._M_t.
                         super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>
                         .super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl);
      bVar2 = llvm::sys::path::is_absolute(&local_100,native);
      if (bVar2) {
        pFVar7 = BuildSystem::getFileSystem(system);
        (*pFVar7->_vptr_FileSystem[4])
                  (absPath.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.
                   InlineElts + 0xff8,pFVar7,
                   input._M_t.
                   super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>
                   .super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl);
        std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::operator=
                  (&local_e8,
                   (unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> *)
                   (absPath.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.
                    InlineElts + 0xff8));
        std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::~unique_ptr
                  ((unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> *)
                   (absPath.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.
                    InlineElts + 0xff8));
      }
      else {
        uVar6 = std::__cxx11::string::data();
        local_1128.Data = (char *)uVar6;
        uVar6 = std::__cxx11::string::length();
        local_1128.Length = uVar6;
        llvm::SmallString<4096U>::SmallString((SmallString<4096U> *)local_1118,local_1128);
        llvm::Twine::Twine(&local_1140,
                           (string *)
                           input._M_t.
                           super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>
                           .super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl);
        llvm::Twine::Twine(&local_1158,"");
        llvm::Twine::Twine(&local_1170,"");
        llvm::Twine::Twine(&local_1188,"");
        llvm::sys::path::append
                  ((SmallVectorImpl<char> *)local_1118,&local_1140,&local_1158,&local_1170,
                   &local_1188);
        eVar11 = llvm::sys::fs::make_absolute((SmallVectorImpl<char> *)local_1118);
        local_1190 = eVar11._M_cat;
        local_1198 = eVar11._M_value;
        pFVar7 = BuildSystem::getFileSystem(system);
        local_11d0 = llvm::SmallString::operator_cast_to_StringRef((SmallString *)local_1118);
        llvm::StringRef::operator_cast_to_string(&local_11c0,&local_11d0);
        (*pFVar7->_vptr_FileSystem[4])(&local_11a0,pFVar7,&local_11c0);
        std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::operator=
                  (&local_e8,&local_11a0);
        std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::~unique_ptr
                  (&local_11a0);
        std::__cxx11::string::~string((string *)&local_11c0);
        llvm::SmallString<4096U>::~SmallString((SmallString<4096U> *)local_1118);
      }
      bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_e8);
      if (bVar2) {
        switch(this->depsStyle) {
        case Unused:
          __assert_fail("0 && \"unreachable\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/ShellCommand.cpp"
                        ,0x68,
                        "bool llbuild::buildsystem::ShellCommand::processDiscoveredDependencies(BuildSystem &, core::TaskInterface, QueueJobContext *)"
                       );
        case Makefile:
          pcVar8 = (char *)std::__cxx11::string::data();
          sVar9 = std::__cxx11::string::length();
          pMVar10 = std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::
                    get(&local_e8);
          depsPath_00.Length = sVar9;
          depsPath_00.Data = pcVar8;
          bVar2 = processMakefileDiscoveredDependencies
                            (this,system,ti,context,depsPath_00,pMVar10,false);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            local_1224 = 3;
          }
          else {
            ti_local.ctx._7_1_ = 0;
            local_1224 = 1;
          }
          break;
        case DependencyInfo:
          pcVar8 = (char *)std::__cxx11::string::data();
          sVar9 = std::__cxx11::string::length();
          pMVar10 = std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::
                    get(&local_e8);
          depsPath_01.Length = sVar9;
          depsPath_01.Data = pcVar8;
          bVar2 = processDependencyInfoDiscoveredDependencies
                            (this,system,ti,context,depsPath_01,pMVar10);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            local_1224 = 3;
          }
          else {
            ti_local.ctx._7_1_ = 0;
            local_1224 = 1;
          }
          break;
        case MakefileIgnoringSubsequentOutputs:
          pcVar8 = (char *)std::__cxx11::string::data();
          sVar9 = std::__cxx11::string::length();
          pMVar10 = std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::
                    get(&local_e8);
          depsPath_02.Length = sVar9;
          depsPath_02.Data = pcVar8;
          bVar2 = processMakefileDiscoveredDependencies
                            (this,system,ti,context,depsPath_02,pMVar10,true);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            local_1224 = 3;
          }
          else {
            ti_local.ctx._7_1_ = 0;
            local_1224 = 1;
          }
          break;
        default:
          llvm::report_fatal_error("unknown dependencies style",true);
        }
      }
      else {
        pBVar3 = BuildSystem::getDelegate(system);
        std::operator+(&local_1220,"unable to open dependencies file (",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       input._M_t.
                       super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>
                       .super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl);
        std::operator+(&local_1200,&local_1220,")");
        local_11e0 = std::__cxx11::string::data();
        uVar6 = std::__cxx11::string::length();
        (*pBVar3->_vptr_BuildSystemDelegate[0xb])(pBVar3,this,local_11e0,uVar6);
        std::__cxx11::string::~string((string *)&local_1200);
        std::__cxx11::string::~string((string *)&local_1220);
        ti_local.ctx._7_1_ = 0;
        local_1224 = 1;
      }
      std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::~unique_ptr
                (&local_e8);
      if (local_1224 == 1) goto LAB_002b9a75;
    }
    ti_local.ctx._7_1_ = 1;
  }
LAB_002b9a75:
  return (bool)(ti_local.ctx._7_1_ & 1);
}

Assistant:

bool ShellCommand::processDiscoveredDependencies(BuildSystem& system,
                                                 core::TaskInterface ti,
                                                 QueueJobContext* context) {
  // It is an error if the dependencies style is not specified.
  //
  // FIXME: Diagnose this sooner.
  if (depsStyle == DepsStyle::Unused) {
    system.getDelegate().commandHadError(
        this, "missing required 'deps-style' specifier");
    return false;
  }

  for (const auto& depsPath: depsPaths) {
    // Read the dependencies file.
    std::unique_ptr<llvm::MemoryBuffer> input;
    if (llvm::sys::path::is_absolute(depsPath)) {
      input = system.getFileSystem().getFileContents(depsPath);
    } else {
      SmallString<PATH_MAX> absPath = StringRef(workingDirectory);
      llvm::sys::path::append(absPath, depsPath);
      llvm::sys::fs::make_absolute(absPath);
      input = system.getFileSystem().getFileContents(StringRef(absPath));
    }
    if (!input) {
      system.getDelegate().commandHadError(
          this, "unable to open dependencies file (" + depsPath + ")");
      return false;
    }

    switch (depsStyle) {
    case DepsStyle::Unused:
      assert(0 && "unreachable");
      break;

    case DepsStyle::Makefile:
      if (!processMakefileDiscoveredDependencies(
              system, ti, context, depsPath, input.get(), false))
        return false;
      continue;

    case DepsStyle::DependencyInfo:
      if (!processDependencyInfoDiscoveredDependencies(
              system, ti, context, depsPath, input.get()))
        return false;
      continue;

    case DepsStyle::MakefileIgnoringSubsequentOutputs:
      if (!processMakefileDiscoveredDependencies(
              system, ti, context, depsPath, input.get(), true))
        return false;
      continue;
    }
      
    llvm::report_fatal_error("unknown dependencies style");
  }

  return true;
}